

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

void tinyexr::hufFreeDecTable(HufDec *hdecod)

{
  void *pvVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    pvVar1 = *(void **)((long)&hdecod->p + lVar2);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
      *(undefined8 *)((long)&hdecod->p + lVar2) = 0;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40000);
  return;
}

Assistant:

void hufFreeDecTable(HufDec *hdecod)  // io: Decoding table
{
  for (int i = 0; i < HUF_DECSIZE; i++) {
    if (hdecod[i].p) {
      delete[] hdecod[i].p;
      hdecod[i].p = 0;
    }
  }
}